

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int log_configure_impl(char *name,size_t size,...)

{
  uint uVar1;
  int iVar2;
  log_impl plVar3;
  ulong in_RSI;
  log_policy policy;
  va_list variable_args;
  size_t iterator;
  log_impl impl;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  uint local_48;
  ulong local_28;
  int local_4;
  
  plVar3 = log_singleton_get(in_stack_fffffffffffffee0);
  if ((plVar3 == (log_impl)0x0) && (iVar2 = log_create(in_stack_fffffffffffffed8), iVar2 != 0)) {
    local_4 = 1;
  }
  else {
    local_48 = 0x10;
    for (local_28 = 0; uVar1 = local_48, local_28 < in_RSI; local_28 = local_28 + 1) {
      if (local_48 < 0x29) {
        local_48 = local_48 + 8;
      }
      iVar2 = log_define(in_stack_fffffffffffffef8,
                         (log_policy)CONCAT44(uVar1,in_stack_fffffffffffffef0));
      if (iVar2 != 0) {
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int log_configure_impl(const char *name, size_t size, ...)
{
	log_impl impl = log_singleton_get(name);

	size_t iterator;

	va_list variable_args;

	if (impl == NULL)
	{
		if (log_create(name) != 0)
		{
			return 1;
		}
	}

	va_start(variable_args, size);

	for (iterator = 0; iterator < size; ++iterator)
	{
		log_policy policy = va_arg(variable_args, log_policy);

		if (log_define(name, policy) != 0)
		{
			va_end(variable_args);

			return 1;
		}
	}

	va_end(variable_args);

	return 0;
}